

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_compress_stdin_open(char *filename,int rwmode,int *hdl)

{
  char *pcVar1;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *ptr;
  int status;
  int *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_ESI == 0) {
    local_4 = mem_createmem(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0);
    if (local_4 == 0) {
      local_4 = mem_uncompress2mem(in_RDI,(FILE *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                   (int)((ulong)in_RDX >> 0x20));
      if (local_4 == 0) {
        if (memTable[*in_RDX].fitsfilesize + 0x100U < *memTable[*in_RDX].memsizeptr) {
          pcVar1 = (char *)realloc(*memTable[*in_RDX].memaddrptr,memTable[*in_RDX].fitsfilesize);
          if (pcVar1 == (char *)0x0) {
            ffpmsg((char *)0x13accb);
            return 0x71;
          }
          *memTable[*in_RDX].memaddrptr = pcVar1;
          *memTable[*in_RDX].memsizeptr = memTable[*in_RDX].fitsfilesize;
        }
        local_4 = 0;
      }
      else {
        mem_close_free(0);
        ffpmsg((char *)0x13ac23);
      }
    }
    else {
      ffpmsg((char *)0x13abd8);
    }
  }
  else {
    ffpmsg((char *)0x13aba5);
    local_4 = 0x70;
  }
  return local_4;
}

Assistant:

int mem_compress_stdin_open(char *filename, int rwmode, int *hdl)
/*
  This routine reads the compressed input stream and creates an empty memory
  buffer, then calls mem_uncompress2mem.
*/
{
    int status;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
        return(READONLY_FILE);
    }
 
    /* create a memory file for the uncompressed file */
    status = mem_createmem(28800, hdl);

    if (status)
    {
        ffpmsg("failed to create empty memory file (compress_stdin_open)");
        return(status);
    }

    /* uncompress file into memory */
    status = mem_uncompress2mem(filename, stdin, *hdl);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to uncompress stdin into memory (compress_stdin_open)");
        return(status);
    }

    /* if we allocated too much memory initially, then free it */
    if (*(memTable[*hdl].memsizeptr) > 
       (( (size_t) memTable[*hdl].fitsfilesize) + 256L) ) 
    {
        ptr = realloc(*(memTable[*hdl].memaddrptr), 
                      ((size_t) memTable[*hdl].fitsfilesize) );
        if (!ptr)
        {
            ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[*hdl].memaddrptr) = ptr;
        *(memTable[*hdl].memsizeptr) = (size_t) (memTable[*hdl].fitsfilesize);
    }

    return(0);
}